

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * container_clone(container_t *c,uint8_t typecode)

{
  byte local_19;
  array_container_t *paStack_18;
  uint8_t typecode_local;
  container_t *c_local;
  
  local_19 = typecode;
  paStack_18 = (array_container_t *)c;
  paStack_18 = (array_container_t *)container_unwrap_shared(c,&local_19);
  switch(local_19) {
  case 1:
    c_local = bitset_container_clone((bitset_container_t *)paStack_18);
    break;
  case 2:
    c_local = array_container_clone(paStack_18);
    break;
  case 3:
    c_local = run_container_clone((run_container_t *)paStack_18);
    break;
  case 4:
    printf("shared containers are not cloneable\n");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x2d2c,"container_t *container_clone(const container_t *, uint8_t)");
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x2d2f,"container_t *container_clone(const container_t *, uint8_t)");
  }
  return c_local;
}

Assistant:

container_t *container_clone(const container_t *c, uint8_t typecode) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_clone(const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_clone(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_clone(const_CAST_run(c));
        case SHARED_CONTAINER_TYPE:
            printf("shared containers are not cloneable\n");
            assert(false);
            return NULL;
        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}